

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_get_int_int(Conf *conf,int primary,int secondary)

{
  void *pvVar1;
  conf_entry *entry;
  key key;
  int secondary_local;
  int primary_local;
  Conf *conf_local;
  
  key.secondary.i = secondary;
  key.secondary._4_4_ = primary;
  if (subkeytypes[primary] != 2) {
    __assert_fail("subkeytypes[primary] == TYPE_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x128,"int conf_get_int_int(Conf *, int, int)");
  }
  if (valuetypes[primary] == 2) {
    entry._0_4_ = primary;
    key.primary = secondary;
    pvVar1 = find234(conf->tree,&entry,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      return *(int *)((long)pvVar1 + 0x10);
    }
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x12d,"int conf_get_int_int(Conf *, int, int)");
  }
  __assert_fail("valuetypes[primary] == TYPE_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x129,"int conf_get_int_int(Conf *, int, int)");
}

Assistant:

int conf_get_int_int(Conf *conf, int primary, int secondary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_INT);
    assert(valuetypes[primary] == TYPE_INT);
    key.primary = primary;
    key.secondary.i = secondary;
    entry = find234(conf->tree, &key, NULL);
    assert(entry);
    return entry->value.u.intval;
}